

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodesStamp.hpp
# Opt level: O2

void __thiscall OpenMD::NodesStamp::~NodesStamp(NodesStamp *this)

{
  ~NodesStamp(this);
  operator_delete(this,0x88);
  return;
}

Assistant:

NodesStamp() {}